

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene::_InternalSerialize
          (VisionFeaturePrint_Scene *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  void *data;
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  int size;
  ulong uVar5;
  uint8_t *puVar6;
  size_t __n;
  
  uVar3 = this->version_;
  puVar6 = target;
  if (uVar3 != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar3 = this->version_;
    }
    *target = '\b';
    target[1] = (byte)uVar3;
    if (uVar3 < 0x80) {
      puVar6 = target + 2;
    }
    else {
      target[1] = (byte)uVar3 | 0x80;
      target[2] = (uint8_t)((ulong)(long)(int)uVar3 >> 7);
      puVar6 = target + 3;
      if (0x3fff < uVar3) {
        uVar5 = (ulong)target[2];
        uVar2 = (ulong)(long)(int)uVar3 >> 7;
        do {
          puVar6[-1] = (byte)uVar5 | 0x80;
          uVar4 = uVar2 >> 7;
          *puVar6 = (uint8_t)uVar4;
          puVar6 = puVar6 + 1;
          uVar5 = uVar4 & 0xffffffff;
          bVar1 = 0x3fff < uVar2;
          uVar2 = uVar4;
        } while (bVar1);
      }
    }
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    uVar2 = uVar2 & 0xfffffffffffffffc;
    data = *(void **)(uVar2 + 8);
    size = (int)*(undefined8 *)(uVar2 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)puVar6 < (long)__n) {
      puVar6 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,puVar6);
      return puVar6;
    }
    memcpy(puVar6,data,__n);
    puVar6 = puVar6 + __n;
  }
  return puVar6;
}

Assistant:

uint8_t* VisionFeaturePrint_Scene::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene.SceneVersion version = 1;
  if (this->_internal_version() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      1, this->_internal_version(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene)
  return target;
}